

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

UStringTrieResult __thiscall
icu_63::UCharsTrie::next(UCharsTrie *this,ConstChar16Ptr *ptr,int32_t sLength)

{
  UStringTrieResult UVar1;
  UStringTrieResult local_68;
  UStringTrieResult local_64;
  uint local_4c;
  UStringTrieResult result;
  int32_t node;
  int32_t node_2;
  int32_t node_1;
  int32_t uchar;
  int32_t length;
  UChar *pos;
  UChar *s;
  int32_t sLength_local;
  ConstChar16Ptr *ptr_local;
  UCharsTrie *this_local;
  
  pos = ConstChar16Ptr::operator_cast_to_char16_t_(ptr);
  if (sLength < 0) {
    if (*pos == L'\0') {
LAB_002001f9:
      UVar1 = current(this);
      return UVar1;
    }
  }
  else if (sLength == 0) goto LAB_002001f9;
  _uchar = this->pos_;
  if (_uchar != (char16_t *)0x0) {
    node_1 = this->remainingMatchLength_;
    s._4_4_ = sLength;
    while( true ) {
      if (s._4_4_ < 0) {
        while( true ) {
          node_2 = (int32_t)(ushort)*pos;
          if (node_2 == 0) {
            this->remainingMatchLength_ = node_1;
            this->pos_ = _uchar;
            if ((node_1 < 0) && (0x3f < (ushort)*_uchar)) {
              local_64 = valueResult((uint)(ushort)*_uchar);
            }
            else {
              local_64 = USTRINGTRIE_NO_VALUE;
            }
            return local_64;
          }
          if (node_1 < 0) break;
          if (node_2 != (uint)(ushort)*_uchar) {
            stop(this);
            return USTRINGTRIE_NO_MATCH;
          }
          _uchar = _uchar + 1;
          node_1 = node_1 + -1;
          pos = pos + 1;
        }
        this->remainingMatchLength_ = node_1;
        pos = pos + 1;
      }
      else {
        while( true ) {
          if (s._4_4_ == 0) {
            this->remainingMatchLength_ = node_1;
            this->pos_ = _uchar;
            if ((node_1 < 0) && (0x3f < (ushort)*_uchar)) {
              local_68 = valueResult((uint)(ushort)*_uchar);
            }
            else {
              local_68 = USTRINGTRIE_NO_VALUE;
            }
            return local_68;
          }
          node_2 = (int32_t)(ushort)*pos;
          s._4_4_ = s._4_4_ + -1;
          if (node_1 < 0) break;
          if (node_2 != (uint)(ushort)*_uchar) {
            stop(this);
            return USTRINGTRIE_NO_MATCH;
          }
          _uchar = _uchar + 1;
          node_1 = node_1 + -1;
          pos = pos + 1;
        }
        this->remainingMatchLength_ = node_1;
        pos = pos + 1;
      }
      local_4c = (uint)(ushort)*_uchar;
      _uchar = _uchar + 1;
      while( true ) {
        while (local_4c < 0x30) {
          UVar1 = branchNext(this,_uchar,local_4c,node_2);
          if (UVar1 == USTRINGTRIE_NO_MATCH) {
            return USTRINGTRIE_NO_MATCH;
          }
          if (s._4_4_ < 0) {
            node_2 = (int32_t)(ushort)*pos;
            if (node_2 == 0) {
              return UVar1;
            }
          }
          else {
            if (s._4_4_ == 0) {
              return UVar1;
            }
            node_2 = (int32_t)(ushort)*pos;
            s._4_4_ = s._4_4_ + -1;
          }
          pos = pos + 1;
          if (UVar1 == USTRINGTRIE_FINAL_VALUE) {
            stop(this);
            return USTRINGTRIE_NO_MATCH;
          }
          _uchar = this->pos_ + 1;
          local_4c = (uint)(ushort)*this->pos_;
        }
        if (local_4c < 0x40) break;
        if ((local_4c & 0x8000) != 0) {
          stop(this);
          return USTRINGTRIE_NO_MATCH;
        }
        _uchar = skipNodeValue(_uchar,local_4c);
        local_4c = local_4c & 0x3f;
      }
      if (node_2 != (uint)(ushort)*_uchar) break;
      _uchar = _uchar + 1;
      node_1 = local_4c - 0x31;
    }
    stop(this);
  }
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
UCharsTrie::next(ConstChar16Ptr ptr, int32_t sLength) {
    const UChar *s=ptr;
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input unit, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t uchar;
        if(sLength<0) {
            for(;;) {
                if((uchar=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                uchar=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        int32_t node=*pos++;
        for(;;) {
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, uchar);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input unit, if there is one.
                if(sLength<0) {
                    if((uchar=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    uchar=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching units.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
                node=*pos++;
            } else if(node<kMinValueLead) {
                // Match length+1 units.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching units.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipNodeValue(pos, node);
                node&=kNodeTypeMask;
            }
        }
    }
}